

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O3

bool __thiscall
unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::empty
          (mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  uintptr_t uVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar2 == 0) {
    uVar1 = (this->db_).root.tagged_ptr;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return uVar1 == 0;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

[[nodiscard]] auto empty() const {
    const std::lock_guard guard{mutex};
    return db_.empty();
  }